

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::GetEnumerator
          (JavascriptProxy *this,JavascriptStaticEnumerator *enumerator,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  bool bVar1;
  ScriptContext *scriptContext;
  Recycler *pRVar2;
  JavascriptEnumerator *prefixEnumerator;
  TrackAllocData local_78;
  JavascriptEnumerator *local_50;
  ProxyOwnkeysEnumerator *ownKeysEnum;
  JavascriptArray *trapResult;
  ThreadContext *threadContext;
  EnumeratorCache *enumeratorCache_local;
  ScriptContext *requestContext_local;
  JavascriptStaticEnumerator *pJStack_20;
  EnumeratorFlags flags_local;
  JavascriptStaticEnumerator *enumerator_local;
  JavascriptProxy *this_local;
  
  threadContext = (ThreadContext *)enumeratorCache;
  enumeratorCache_local = (EnumeratorCache *)requestContext;
  requestContext_local._7_1_ = flags;
  pJStack_20 = enumerator;
  enumerator_local = (JavascriptStaticEnumerator *)this;
  trapResult = (JavascriptArray *)ScriptContext::GetThreadContext(requestContext);
  bVar1 = ThreadContext::IsDisableImplicitCall((ThreadContext *)trapResult);
  if (bVar1) {
    ThreadContext::AddImplicitCallFlags((ThreadContext *)trapResult,ImplicitCall_External);
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = IsRevoked(this);
    if (bVar1) {
      bVar1 = ThreadContext::RecordImplicitException((ThreadContext *)trapResult);
      if (bVar1) {
        scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea15,L"ownKeys");
      }
      this_local._4_4_ = 0;
    }
    else {
      ownKeysEnum = (ProxyOwnkeysEnumerator *)
                    Js::JavascriptOperators::GetOwnPropertyNames
                              (this,(ScriptContext *)enumeratorCache_local);
      pRVar2 = ScriptContext::GetRecycler((ScriptContext *)enumeratorCache_local);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_78,
                 (type_info *)
                 &GetEnumerator(Js::JavascriptStaticEnumerator*,Js::EnumeratorFlags,Js::ScriptContext*,Js::EnumeratorCache*)
                  ::ProxyOwnkeysEnumerator::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                 ,0x41f);
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_78);
      prefixEnumerator = (JavascriptEnumerator *)new<Memory::Recycler>(0x38,pRVar2,0x43c4b0);
      GetEnumerator(Js::JavascriptStaticEnumerator*,Js::EnumeratorFlags,Js::ScriptContext*,Js::
      EnumeratorCache*)::ProxyOwnkeysEnumerator::ProxyOwnkeysEnumerator(Js::ScriptContext*,Js::
      JavascriptProxy*,Js::JavascriptArray__
                (prefixEnumerator,(ScriptContext *)enumeratorCache_local,this,
                 (JavascriptArray *)ownKeysEnum);
      local_50 = prefixEnumerator;
      bVar1 = JavascriptStaticEnumerator::Initialize
                        (pJStack_20,prefixEnumerator,(ArrayObject *)0x0,(DynamicObject *)0x0,
                         requestContext_local._7_1_,(ScriptContext *)enumeratorCache_local,
                         (EnumeratorCache *)threadContext);
      this_local._4_4_ = (uint)bVar1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::GetEnumerator(JavascriptStaticEnumerator * enumerator, EnumeratorFlags flags, ScriptContext* requestContext, EnumeratorCache * enumeratorCache)
    {
        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        // 1. Assert: Either Type(V) is Object or Type(V) is Null.
        // 2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        // 3. If handler is null, then throw a TypeError exception.
        if (IsRevoked())
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("ownKeys"));
        }

        struct ProxyOwnkeysEnumerator : public JavascriptEnumerator
        {
            typedef JsUtil::BaseHashSet<JsUtil::CharacterBuffer<WCHAR>, Recycler> VisitedNamesHashSet;
            Field(VisitedNamesHashSet*) visited;
            Field(JavascriptArray*) trapResult;
            Field(JavascriptProxy*) proxy;
            FieldNoBarrier(ScriptContext*) scriptContext;
            Field(uint32) index;

            DEFINE_VTABLE_CTOR_ABSTRACT(ProxyOwnkeysEnumerator, JavascriptEnumerator)

            ProxyOwnkeysEnumerator(ScriptContext* scriptContext, JavascriptProxy* proxy, JavascriptArray* trapResult)
                :JavascriptEnumerator(scriptContext), scriptContext(scriptContext), proxy(proxy), trapResult(trapResult)
            {
                visited = RecyclerNew(scriptContext->GetRecycler(), VisitedNamesHashSet, scriptContext->GetRecycler());
            }
            virtual void Reset() override
            {
                index = 0;
                visited->Reset();
            }

            virtual JavascriptString * MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes = nullptr) override
            {
                propertyId = Constants::NoProperty;
                if (attributes != nullptr)
                {
                    *attributes = PropertyEnumerable;
                }
                // 13.7.5.15 EnumerateObjectProperties(O) (https://tc39.github.io/ecma262/#sec-enumerate-object-properties)
                // for (let key of Reflect.ownKeys(obj)) {
                uint32 len = trapResult->GetLength();
                while (index < len)
                {
                    Var var = trapResult->DirectGetItem(index++) ;
                    if (var)
                    {
                        // if (typeof key === "string") {
                        if (VarIs<JavascriptString>(var))
                        {
                            JavascriptString* propertyName = VarTo<JavascriptString>(var);
                            // let desc = Reflect.getOwnPropertyDescriptor(obj, key);
                            Js::PropertyDescriptor desc;
                            BOOL ret = JavascriptOperators::GetOwnPropertyDescriptor(proxy, propertyName, scriptContext, &desc);
                            const JsUtil::CharacterBuffer<WCHAR> propertyString(propertyName->GetString(), propertyName->GetLength());
                            // if (desc && !visited.has(key)) {
                            if (ret && !visited->Contains(propertyString))
                            {
                                visited->Add(propertyString);
                                // if (desc.enumerable) yield key;
                                if (desc.IsEnumerable())
                                {
                                    return VarTo<JavascriptString>(CrossSite::MarshalVar(
                                      scriptContext, propertyName, propertyName->GetScriptContext()));
                                }
                            }
                        }
                    }
                }
                return nullptr;
            }
        };

        JavascriptArray* trapResult = JavascriptOperators::GetOwnPropertyNames(this, requestContext);
        ProxyOwnkeysEnumerator* ownKeysEnum = RecyclerNew(requestContext->GetRecycler(), ProxyOwnkeysEnumerator, requestContext, this, trapResult);

        return enumerator->Initialize(ownKeysEnum, nullptr, nullptr, flags, requestContext, enumeratorCache);
    }